

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

bool slang::syntax::PortExpressionSyntax::isKind(SyntaxKind kind)

{
  return (kind - PortConcatenation & 0xfffffffd) == 0;
}

Assistant:

bool PortExpressionSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::PortConcatenation:
        case SyntaxKind::PortReference:
            return true;
        default:
            return false;
    }
}